

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

float frandGaussian(float mu,float sigma)

{
  byte bVar1;
  long in_FS_OFFSET;
  float fVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  
  bVar1 = *(byte *)(in_FS_OFFSET + -4);
  *(byte *)(in_FS_OFFSET + -4) = bVar1 ^ 1;
  if (bVar1 == 1) {
    fVar2 = *(float *)(in_FS_OFFSET + -8);
  }
  else {
    fVar2 = frand();
    fVar3 = frand();
    dVar4 = log((double)(1.0 - fVar2));
    dVar4 = dVar4 * -2.0;
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    dVar5 = cos((double)(fVar3 * 6.2831855));
    fVar2 = (float)(dVar5 * (double)(float)dVar4);
    dVar5 = sin((double)(fVar3 * 6.2831855));
    *(float *)(in_FS_OFFSET + -8) = (float)(dVar5 * (double)(float)dVar4);
  }
  return fVar2 * sigma + mu;
}

Assistant:

float frandGaussian(float mu, float sigma) {
	static const float two_pi = 2.0*3.14159265358979323846;

	thread_local float z1;
	thread_local bool generate;
	generate = !generate;

	if (!generate)
	   return z1 * sigma + mu;

	float u1 = frand();
    float u2 = frand();

    float t = sqrt(-2.0f * log(1.0f - u1));

	float z0 = t*cos(two_pi*u2);
	z1 = t*sin(two_pi*u2);

	return z0 * sigma + mu;
}